

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O2

int mbedtls_asn1_get_alg_null(uchar **p,uchar *end,mbedtls_asn1_buf *alg)

{
  int iVar1;
  int iVar2;
  undefined1 auStack_28 [8];
  mbedtls_asn1_buf params;
  
  auStack_28 = (undefined1  [8])0x0;
  params.tag = 0;
  params._4_4_ = 0;
  params.len = 0;
  iVar1 = mbedtls_asn1_get_alg(p,end,alg,(mbedtls_asn1_buf *)auStack_28);
  if (iVar1 == 0) {
    iVar2 = 0;
    if (params._0_8_ != 0) {
      iVar2 = -0x68;
    }
    iVar1 = -0x68;
    if (auStack_28._0_4_ == 0) {
      iVar1 = iVar2;
    }
    if (auStack_28._0_4_ == 5) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_asn1_get_alg_null(unsigned char **p,
                              const unsigned char *end,
                              mbedtls_asn1_buf *alg)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_asn1_buf params;

    memset(&params, 0, sizeof(mbedtls_asn1_buf));

    if ((ret = mbedtls_asn1_get_alg(p, end, alg, &params)) != 0) {
        return ret;
    }

    if ((params.tag != MBEDTLS_ASN1_NULL && params.tag != 0) || params.len != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }

    return 0;
}